

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

int str_gsub(lua_State *L)

{
  char cVar1;
  int iVar2;
  lua_Integer lVar3;
  char *pcVar4;
  char *e_00;
  char *e;
  luaL_Buffer b;
  MatchState ms;
  int n;
  int anchor;
  int max_s;
  int tr;
  char *p;
  char *src;
  size_t srcl;
  lua_State *L_local;
  
  srcl = (size_t)L;
  p = luaL_checklstring(L,1,(size_t *)&src);
  _max_s = luaL_checklstring((lua_State *)srcl,2,(size_t *)0x0);
  iVar2 = lua_type((lua_State *)srcl,3);
  lVar3 = luaL_optinteger((lua_State *)srcl,4,(lua_Integer)(src + 1));
  cVar1 = *_max_s;
  if (cVar1 == '^') {
    _max_s = _max_s + 1;
  }
  ms.capture[0x1f].len._0_4_ = 0;
  if ((((iVar2 != 3) && (iVar2 != 4)) && (iVar2 != 6)) && (iVar2 != 5)) {
    luaL_argerror((lua_State *)srcl,3,"string/function/table expected");
  }
  luaL_buffinit((lua_State *)srcl,(luaL_Buffer *)&e);
  pcVar4 = p + (long)src;
  b.buffer._8184_8_ = p;
  do {
    if ((int)lVar3 <= (int)ms.capture[0x1f].len) break;
    e_00 = match((MatchState *)(b.buffer + 0x1ff8),p,_max_s);
    if (e_00 == (char *)0x0) {
LAB_0011b372:
      if (pcVar4 <= p) break;
      if (b.buffer + 0x1ff8 <= e) {
        luaL_prepbuffer((luaL_Buffer *)&e);
      }
      *e = *p;
      e = e + 1;
      e_00 = p + 1;
    }
    else {
      ms.capture[0x1f].len._0_4_ = (int)ms.capture[0x1f].len + 1;
      add_value((MatchState *)(b.buffer + 0x1ff8),(luaL_Buffer *)&e,p,e_00);
      if (e_00 <= p) goto LAB_0011b372;
    }
    p = e_00;
  } while (cVar1 != '^');
  luaL_addlstring((luaL_Buffer *)&e,p,(long)pcVar4 - (long)p);
  luaL_pushresult((luaL_Buffer *)&e);
  lua_pushinteger((lua_State *)srcl,(long)(int)ms.capture[0x1f].len);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, srcl+1);
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}